

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inequation.cpp
# Opt level: O0

void __thiscall inequation_Square7_Test::TestBody(inequation_Square7_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr EVar2;
  AssertHelper local_170;
  Message local_168;
  ExprPtr local_160;
  shared_ptr<const_mathiu::impl::Expr> local_150;
  string local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  ExprPtr e;
  ExprPtr local_f0;
  ExprPtr local_e0;
  ExprPtr local_d0;
  ExprPtr local_c0;
  ExprPtr local_b0;
  ExprPtr local_a0;
  ExprPtr local_90;
  undefined1 local_80 [8];
  ExprPtr e2;
  ExprPtr local_50;
  ExprPtr local_40;
  ExprPtr local_30;
  undefined1 local_20 [8];
  ExprPtr e1;
  inequation_Square7_Test *this_local;
  
  e1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  mathiu::impl::operator____s((impl *)&local_40,"x",1);
  mathiu::impl::operator____i((impl *)&local_50,2);
  mathiu::impl::operator^((impl *)&local_30,&local_40,&local_50);
  mathiu::impl::operator____i
            ((impl *)&e2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,1);
  mathiu::impl::operator-
            ((impl *)local_20,&local_30,
             (ExprPtr *)
             &e2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &e2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_50);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_40);
  mathiu::impl::operator____i((impl *)&local_b0,2);
  mathiu::impl::operator____s((impl *)&local_d0,"x",1);
  mathiu::impl::operator____i((impl *)&local_e0,3);
  mathiu::impl::operator-((impl *)&local_c0,&local_d0,&local_e0);
  mathiu::impl::operator*((impl *)&local_a0,&local_b0,&local_c0);
  mathiu::impl::operator____i((impl *)&local_f0,2);
  mathiu::impl::operator^((impl *)&local_90,&local_a0,&local_f0);
  mathiu::impl::operator____i
            ((impl *)&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,3);
  mathiu::impl::operator-
            ((impl *)local_80,&local_90,
             (ExprPtr *)
             &e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_90);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_f0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_a0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_c0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_e0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_d0);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_b0);
  mathiu::impl::operator>((impl *)&gtest_ar.message_,(ExprPtr *)local_20,(ExprPtr *)local_80);
  mathiu::impl::operator____s((impl *)&local_160,"x",1);
  EVar2 = mathiu::impl::solveInequation
                    ((impl *)&local_150,(ExprPtr *)&gtest_ar.message_,&local_160,
                     (ExprPtr *)mathiu::impl::true_);
  mathiu::impl::toString_abi_cxx11_
            (&local_140,(impl *)&local_150,
             (ExprPtr *)
             EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[78],_nullptr>
            ((EqHelper *)local_120,"toString(solveInequation(e, \"x\"_s))",
             "\"(OOInterval (* 1/-6 (+ -24 (* -1 (^ 168 1/2)))) (* 1/-6 (+ -24 (^ 168 1/2))))\"",
             &local_140,
             (char (*) [78])
             "(OOInterval (* 1/-6 (+ -24 (* -1 (^ 168 1/2)))) (* 1/-6 (+ -24 (^ 168 1/2))))");
  std::__cxx11::string::~string((string *)&local_140);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_150);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/inequation.cpp"
               ,0x77,message);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_80);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  return;
}

Assistant:

TEST(inequation, Square7)
{
    auto const e1 = ("x"_s ^ 2_i) - 1_i;
    auto const e2 = (2_i*("x"_s - 3_i) ^ 2_i) - 3_i;;
    auto const e = e1 > e2;
    EXPECT_EQ(toString(solveInequation(e, "x"_s)), "(OOInterval (* 1/-6 (+ -24 (* -1 (^ 168 1/2)))) (* 1/-6 (+ -24 (^ 168 1/2))))");
}